

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<float> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  float p2y;
  int iVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  pointer ppVar3;
  bool bVar4;
  type piVar5;
  type pfVar6;
  reference pvVar7;
  iterator iVar8;
  difference_type dVar9;
  pointer ppVar10;
  iterator iVar11;
  difference_type value_00;
  float fVar12;
  int local_148;
  int i_1;
  float value;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_e8;
  pair<float,_int> *local_e0;
  pair<float,_int> *local_d8;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_d0;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_c8;
  pair<float,_int> *local_c0;
  pair<float,_int> *local_b8;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_b0;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_a8;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  next;
  iterator end;
  iterator begin;
  pair<float,_int> local_78;
  int local_70;
  allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_> local_69;
  int i;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
  q;
  allocator<std::pair<float,_int>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> r;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng_local;
  int n_local;
  quadratic_cost_type<float> *this_local;
  
  r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)rng;
  std::allocator<std::pair<float,_int>_>::allocator(&local_39);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38,
             (long)n,&local_39);
  std::allocator<std::pair<float,_int>_>::~allocator(&local_39);
  piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar1 = *piVar5;
  std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>::allocator
            (&local_69);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
  ::vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
            *)&i,(long)iVar1,&local_69);
  std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>::~allocator
            (&local_69);
  for (local_70 = 0; local_70 != n; local_70 = local_70 + 1) {
    pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)local_70);
    std::pair<float,_int>::pair<float_&,_int_&,_true>(&local_78,pfVar6,&local_70);
    pvVar7 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        local_38,(long)local_70);
    std::pair<float,_int>::operator=(pvVar7,&local_78);
  }
  iVar8 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                    ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     local_38);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,baryonyx::itm::quadratic_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar8._M_current);
  end = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   local_38);
  next._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38
                 );
  local_b0._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38
                 );
  local_a8 = __gnu_cxx::
             __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
             ::operator++(&local_b0,0);
  while (bVar4 = __gnu_cxx::
                 operator==<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                           (&local_a8,&next), ((bVar4 ^ 0xffU) & 1) != 0) {
    ppVar10 = __gnu_cxx::
              __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
              ::operator->(&local_a8);
    fVar12 = ppVar10->first;
    ppVar10 = __gnu_cxx::
              __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
              ::operator->(&end);
    if ((fVar12 != ppVar10->first) || (NAN(fVar12) || NAN(ppVar10->first))) {
      local_b8 = end._M_current;
      local_c0 = local_a8._M_current;
      dVar9 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )end._M_current,local_a8);
      ppVar3 = r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (1 < dVar9) {
        local_c8._M_current = end._M_current;
        local_d0._M_current = local_a8._M_current;
        ppVar10 = __gnu_cxx::
                  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  ::operator->(&end);
        fVar12 = ppVar10->first;
        ppVar10 = __gnu_cxx::
                  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  ::operator->(&local_a8);
        random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                  (local_c8,local_d0,(random_engine *)ppVar3,fVar12,ppVar10->first);
      }
      end._M_current = local_a8._M_current;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
    ::operator++(&local_a8);
  }
  local_d8 = end._M_current;
  local_e0 = next._M_current;
  dVar9 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                    ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      )end._M_current,next);
  if (1 < dVar9) {
    local_e8._M_current =
         (pair<float,_int> *)
         std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                   ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    local_38);
    bVar4 = __gnu_cxx::
            operator==<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      (&end,&local_e8);
    ppVar3 = r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar8 = end;
    _Var2 = next;
    if (bVar4) {
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                ::operator->(&end);
      fVar12 = ppVar10->first;
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                ::operator->(&end);
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar8._M_current,_Var2,(random_engine *)ppVar3,fVar12,ppVar10->first + 1.0);
    }
    else {
      pvVar7 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          local_38);
      fVar12 = pvVar7->first;
      iVar8 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         local_38);
      dVar9 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )iVar8._M_current,
                         (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )end._M_current);
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                ::operator->(&end);
      p2y = ppVar10->first;
      iVar8 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         local_38);
      iVar11 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          local_38);
      value_00 = std::
                 distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                           ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             )iVar8._M_current,
                            (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             )iVar11._M_current);
      fVar12 = linearize<long,float>(0,fVar12,dVar9,p2y,value_00);
      ppVar3 = r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar8 = end;
      _Var2 = next;
      ppVar10 = __gnu_cxx::
                __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                ::operator->(&end);
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar8._M_current,_Var2,(random_engine *)ppVar3,ppVar10->first,fVar12);
    }
  }
  iVar8 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                    ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     local_38);
  iVar11 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                     ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                      local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,baryonyx::itm::quadratic_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar8._M_current,iVar11._M_current);
  for (local_148 = 0; local_148 != n; local_148 = local_148 + 1) {
    pvVar7 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        local_38,(long)local_148);
    fVar12 = pvVar7->first;
    pfVar6 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)local_148);
    *pfVar6 = fVar12;
  }
  make_loo_norm(this,n);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
  ::~vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
             *)&i);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }